

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beta_dist.hpp
# Opt level: O0

result_type_conflict1 __thiscall
trng::beta_dist<float>::pdf(beta_dist<float> *this,result_type_conflict1 x)

{
  int *piVar1;
  param_type *in_RDI;
  float in_XMM0_Da;
  result_type_conflict1 rVar2;
  result_type_conflict1 rVar3;
  undefined4 extraout_XMM0_Db;
  double dVar4;
  undefined4 extraout_XMM0_Db_00;
  double dVar5;
  float local_4;
  
  if ((0.0 <= in_XMM0_Da) && (in_XMM0_Da <= 1.0)) {
    if ((((in_XMM0_Da == 0.0) && (!NAN(in_XMM0_Da))) &&
        (rVar2 = param_type::alpha(in_RDI), rVar2 - 1.0 < 0.0)) ||
       (((in_XMM0_Da == 1.0 && (!NAN(in_XMM0_Da))) &&
        (rVar2 = param_type::beta(in_RDI), rVar2 - 1.0 < 0.0)))) {
      piVar1 = __errno_location();
      *piVar1 = 0x21;
      local_4 = std::numeric_limits<float>::quiet_NaN();
    }
    else {
      rVar2 = param_type::norm(in_RDI);
      rVar3 = param_type::alpha(in_RDI);
      dVar4 = std::pow((double)(ulong)(uint)in_XMM0_Da,
                       (double)CONCAT44(extraout_XMM0_Db,rVar3 - 1.0));
      rVar3 = param_type::beta(in_RDI);
      dVar5 = std::pow((double)(ulong)(uint)(1.0 - in_XMM0_Da),
                       (double)CONCAT44(extraout_XMM0_Db_00,rVar3 - 1.0));
      local_4 = (1.0 / rVar2) * SUB84(dVar4,0) * SUB84(dVar5,0);
    }
    return local_4;
  }
  return 0.0;
}

Assistant:

pdf(result_type x) const {
      if (x < 0 or x > 1)
        return 0;
      if ((x == 0 and P.alpha() - 1 < 0) or (x == 1 and P.beta() - 1 < 0)) {
#if !(defined TRNG_CUDA)
        errno = EDOM;
#endif
        return math::numeric_limits<result_type>::quiet_NaN();
      }
      return 1 / P.norm() * math::pow(x, P.alpha() - 1) * math::pow(1 - x, P.beta() - 1);
    }